

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void ra_rename(ASMState *as,Reg down,Reg up)

{
  uint uVar1;
  undefined4 uVar2;
  long lVar3;
  byte bVar4;
  TRef TVar5;
  ASMState *as_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  IRIns *ir;
  IRRef ref;
  IRRef ren;
  IRIns *in_stack_ffffffffffffffc8;
  
  uVar1 = *(uint *)(in_RDI + (ulong)in_ESI * 4);
  *(uint *)(in_RDI + (ulong)in_EDX * 4) = uVar1;
  as_00 = (ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)(uVar1 & 0xffff) * 8);
  bVar4 = (byte)in_EDX;
  *(byte *)((long)as_00->cost + 6) = bVar4;
  *(undefined4 *)(in_RDI + (ulong)in_ESI * 4) = 0;
  *(uint *)(in_RDI + 0xa8) = 1 << ((byte)in_ESI & 0x1f) | *(uint *)(in_RDI + 0xa8);
  *(uint *)(in_RDI + 0xac) = 1 << ((byte)in_ESI & 0x1f) | *(uint *)(in_RDI + 0xac);
  *(uint *)(in_RDI + 0xa8) = (1 << (bVar4 & 0x1f) ^ 0xffffffffU) & *(uint *)(in_RDI + 0xa8);
  *(uint *)(in_RDI + 0xb0) = (1 << (bVar4 & 0x1f) ^ 0xffffffffU) & *(uint *)(in_RDI + 0xb0);
  emit_movrr(as_00,in_stack_ffffffffffffffc8,0,0x178bef);
  if (*(char *)(*(long *)(in_RDI + 0x90) + 7 + (ulong)(uVar1 & 0xffff) * 8) == '\0') {
    lVar3 = *(long *)(in_RDI + 0x98);
    uVar2 = *(undefined4 *)(in_RDI + 0xdc);
    *(undefined2 *)(lVar3 + 0x9c) = 0x1400;
    *(short *)(lVar3 + 0x98) = (short)uVar1;
    *(short *)(lVar3 + 0x9a) = (short)uVar2;
    TVar5 = lj_ir_emit((jit_State *)CONCAT44(in_ESI,in_EDX));
    *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(*(long *)(in_RDI + 0xf8) + 0x10);
    *(char *)(*(long *)(in_RDI + 0x90) + 6 + (ulong)(TVar5 & 0xffff) * 8) = (char)in_ESI;
    *(undefined1 *)(*(long *)(in_RDI + 0x90) + 7 + (ulong)(TVar5 & 0xffff) * 8) = 0;
  }
  return;
}

Assistant:

static void ra_rename(ASMState *as, Reg down, Reg up)
{
  IRRef ren, ref = regcost_ref(as->cost[up] = as->cost[down]);
  IRIns *ir = IR(ref);
  ir->r = (uint8_t)up;
  as->cost[down] = 0;
  lua_assert((down < RID_MAX_GPR) == (up < RID_MAX_GPR));
  lua_assert(!rset_test(as->freeset, down) && rset_test(as->freeset, up));
  ra_free(as, down);  /* 'down' is free ... */
  ra_modified(as, down);
  rset_clear(as->freeset, up);  /* ... and 'up' is now allocated. */
  ra_noweak(as, up);
  RA_DBGX((as, "rename    $f $r $r", regcost_ref(as->cost[up]), down, up));
  emit_movrr(as, ir, down, up);  /* Backwards codegen needs inverse move. */
  if (!ra_hasspill(IR(ref)->s)) {  /* Add the rename to the IR. */
    lj_ir_set(as->J, IRT(IR_RENAME, IRT_NIL), ref, as->snapno);
    ren = tref_ref(lj_ir_emit(as->J));
    as->ir = as->T->ir;  /* The IR may have been reallocated. */
    IR(ren)->r = (uint8_t)down;
    IR(ren)->s = SPS_NONE;
  }
}